

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O0

void highbd_paeth_predictor
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t uVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  uint16_t ytop_left;
  int c;
  int r;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_8;
  
  local_8 = in_RDI;
  for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
      uVar1 = paeth_predictor_single
                        ((uint16_t)((ulong)in_R8 >> 0x30),(uint16_t)((ulong)in_R8 >> 0x20),
                         (uint16_t)((ulong)in_R8 >> 0x10));
      *(uint16_t *)(local_8 + (long)local_30 * 2) = uVar1;
    }
    local_8 = in_RSI * 2 + local_8;
  }
  return;
}

Assistant:

static inline void highbd_paeth_predictor(uint16_t *dst, ptrdiff_t stride,
                                          int bw, int bh, const uint16_t *above,
                                          const uint16_t *left, int bd) {
  int r, c;
  const uint16_t ytop_left = above[-1];
  (void)bd;

  for (r = 0; r < bh; r++) {
    for (c = 0; c < bw; c++)
      dst[c] = paeth_predictor_single(left[r], above[c], ytop_left);
    dst += stride;
  }
}